

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t unpack_half_to_float_3chan_interleave_rev(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint16_t uVar4;
  long *in_RDI;
  float fVar5;
  int x;
  float *out;
  int y;
  int linc0;
  int h;
  int w;
  uint8_t *out0;
  uint16_t *in2;
  uint16_t *in1;
  uint16_t *in0;
  uint8_t *srcbuffer;
  int local_4c;
  float *local_48;
  int local_40;
  float *local_30;
  
  iVar1 = *(int *)(*in_RDI + 0xc);
  iVar2 = *(int *)((long)in_RDI + 0x24);
  iVar3 = *(int *)(*in_RDI + 0x24);
  local_30 = *(float **)(*in_RDI + 0x88);
  for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
    local_48 = local_30;
    for (local_4c = 0; local_4c < iVar1; local_4c = local_4c + 1) {
      uVar4 = one_to_native16(0);
      fVar5 = half_to_float(uVar4);
      *local_48 = fVar5;
      uVar4 = one_to_native16(0);
      fVar5 = half_to_float(uVar4);
      local_48[1] = fVar5;
      uVar4 = one_to_native16(0);
      fVar5 = half_to_float(uVar4);
      local_48[2] = fVar5;
      local_48 = local_48 + 3;
    }
    local_30 = (float *)((long)local_30 + (long)iVar3);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_interleave_rev (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[2].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        float* out = (float*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in2[x]));
            out[1] = half_to_float (one_to_native16 (in1[x]));
            out[2] = half_to_float (one_to_native16 (in0[x]));
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}